

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_size_test.cc
# Opt level: O0

void test_insertion<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<MemoryMapping,boost::intrusive::tree_node_traits<void*>,(boost::intrusive::link_mode_type)1,boost::intrusive::dft_tag,6u>,false>>
               (MemoryContainer<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<MemoryMapping,_boost::intrusive::tree_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_boost::intrusive::dft_tag,_6U>,_false>_>
                *c,vector<MemoryMapping,_std::allocator<MemoryMapping>_> *values,size_t numRepeat)

{
  long *plVar1;
  bool bVar2;
  reference pvVar3;
  tick_type tVar4;
  size_type sVar5;
  size_type sVar6;
  ostream *poVar7;
  reference pvVar8;
  long in_RDX;
  vector<MemoryMapping,_std::allocator<MemoryMapping>_> *in_RSI;
  long *in_RDI;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double total_1;
  size_t max_1;
  size_t i_1;
  size_t found;
  size_t repeat_max_1;
  size_t repeat_1;
  double total;
  size_t max;
  size_t i;
  size_t repeat_max;
  size_t repeat;
  vector<double,_std::allocator<double>_> times;
  ptime tend;
  ptime tini;
  tree_iterator<boost::intrusive::bhtraits<MemoryMapping,_boost::intrusive::tree_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_boost::intrusive::dft_tag,_6U>,_false>
  *in_stack_fffffffffffffe58;
  ostream *in_stack_fffffffffffffe60;
  ostream *in_stack_fffffffffffffe70;
  double local_f8;
  undefined1 local_d8 [8];
  undefined1 local_d0 [8];
  size_type local_c8;
  size_type local_c0;
  base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  local_b8;
  size_type local_b0;
  long local_a8;
  long local_a0;
  double local_98;
  time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
  local_90;
  double local_88;
  base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  local_80;
  size_type local_78;
  size_type local_70;
  base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  local_68;
  long local_50;
  long local_48;
  base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  local_28;
  base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
  local_20;
  long local_18;
  vector<MemoryMapping,_std::allocator<MemoryMapping>_> *local_10;
  long *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  boost::posix_time::ptime::ptime((ptime *)in_stack_fffffffffffffe70);
  boost::posix_time::ptime::ptime((ptime *)in_stack_fffffffffffffe70);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1055d6);
  local_50 = local_18;
  for (local_48 = 0; local_48 != local_50; local_48 = local_48 + 1) {
    (**(code **)(*local_8 + 0x18))();
    local_68.time_.time_count_.value_ =
         (time_rep_type)boost::date_time::microsec_clock<boost::posix_time::ptime>::universal_time()
    ;
    local_70 = 0;
    local_20.time_.time_count_.value_ = local_68.time_.time_count_.value_;
    local_78 = std::vector<MemoryMapping,_std::allocator<MemoryMapping>_>::size(local_10);
    for (; plVar1 = local_8, local_70 != local_78; local_70 = local_70 + 1) {
      pvVar3 = std::vector<MemoryMapping,_std::allocator<MemoryMapping>_>::operator[]
                         (local_10,local_70);
      (**(code **)*plVar1)(plVar1,pvVar3);
    }
    local_80.time_.time_count_.value_ =
         (time_rep_type)boost::date_time::microsec_clock<boost::posix_time::ptime>::universal_time()
    ;
    local_28.time_.time_count_.value_ = local_80.time_.time_count_.value_;
    local_90.ticks_.value_ =
         (impl_type)
         boost::date_time::
         base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
         ::operator-((base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
                      *)in_stack_fffffffffffffe58,(time_type *)0x105739);
    tVar4 = boost::date_time::
            time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
            ::total_nanoseconds((time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                                 *)in_stack_fffffffffffffe60);
    sVar5 = std::vector<MemoryMapping,_std::allocator<MemoryMapping>_>::size(local_10);
    auVar9._8_4_ = (int)(sVar5 >> 0x20);
    auVar9._0_8_ = sVar5;
    auVar9._12_4_ = 0x45300000;
    local_88 = (double)tVar4 /
               ((auVar9._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0));
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe60,
               (value_type_conflict2 *)in_stack_fffffffffffffe58);
    sVar5 = (**(code **)(*local_8 + 0x20))();
    sVar6 = std::vector<MemoryMapping,_std::allocator<MemoryMapping>_>::size(local_10);
    if (sVar5 != sVar6) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"    ERROR: size not consistent");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    }
  }
  local_98 = 0.0;
  while( true ) {
    bVar2 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe70);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pvVar8 = std::vector<double,_std::allocator<double>_>::back
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe60);
    local_98 = *pvVar8 + local_98;
    std::vector<double,_std::allocator<double>_>::pop_back
              ((vector<double,_std::allocator<double>_> *)0x1058ae);
  }
  poVar7 = std::operator<<((ostream *)&std::cout,",");
  auVar10._8_4_ = (int)((ulong)local_18 >> 0x20);
  auVar10._0_8_ = local_18;
  auVar10._12_4_ = 0x45300000;
  std::ostream::operator<<
            (poVar7,local_98 /
                    ((auVar10._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)local_18) - 4503599627370496.0)));
  local_a8 = local_18;
  for (local_a0 = 0; local_a0 != local_a8; local_a0 = local_a0 + 1) {
    local_b0 = 0;
    local_b8.time_.time_count_.value_ =
         (time_rep_type)boost::date_time::microsec_clock<boost::posix_time::ptime>::universal_time()
    ;
    local_c0 = 0;
    local_20.time_.time_count_.value_ = local_b8.time_.time_count_.value_;
    local_c8 = std::vector<MemoryMapping,_std::allocator<MemoryMapping>_>::size(local_10);
    for (; local_c0 != local_c8; local_c0 = local_c0 + 1) {
      (**(code **)(*local_8 + 8))(local_d0);
      plVar1 = local_8;
      pvVar3 = std::vector<MemoryMapping,_std::allocator<MemoryMapping>_>::operator[]
                         (local_10,local_c0);
      (**(code **)(*plVar1 + 0x10))(local_d8,plVar1,pvVar3);
      bVar2 = boost::intrusive::operator!=
                        ((tree_iterator<boost::intrusive::bhtraits<MemoryMapping,_boost::intrusive::tree_node_traits<void_*>,_(boost::intrusive::link_mode_type)1,_boost::intrusive::dft_tag,_6U>,_false>
                          *)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
      local_b0 = bVar2 + local_b0;
    }
    local_28.time_.time_count_.value_ =
         (time_rep_type)boost::date_time::microsec_clock<boost::posix_time::ptime>::universal_time()
    ;
    boost::date_time::
    base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
    ::operator-((base_time<boost::posix_time::ptime,_boost::date_time::counted_time_system<boost::date_time::counted_time_rep<boost::posix_time::millisec_posix_time_system_config>_>_>
                 *)in_stack_fffffffffffffe58,(time_type *)0x105a8f);
    boost::date_time::
    time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
    ::total_nanoseconds((time_duration<boost::posix_time::time_duration,_boost::date_time::time_resolution_traits<boost::date_time::time_resolution_traits_adapted64_impl,_(boost::date_time::time_resolutions)5,_1000000L,_(unsigned_short)6,_long>_>
                         *)in_stack_fffffffffffffe60);
    std::vector<MemoryMapping,_std::allocator<MemoryMapping>_>::size(local_10);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe60,
               (value_type_conflict2 *)in_stack_fffffffffffffe58);
    sVar5 = local_b0;
    sVar6 = std::vector<MemoryMapping,_std::allocator<MemoryMapping>_>::size(local_10);
    if (sVar5 != sVar6) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"    ERROR: not all found, ");
      in_stack_fffffffffffffe70 = (ostream *)std::ostream::operator<<(poVar7,local_b0);
      poVar7 = std::operator<<(in_stack_fffffffffffffe70," found out of ");
      sVar5 = std::vector<MemoryMapping,_std::allocator<MemoryMapping>_>::size(local_10);
      in_stack_fffffffffffffe60 = (ostream *)std::ostream::operator<<(poVar7,sVar5);
      std::ostream::operator<<(in_stack_fffffffffffffe60,std::endl<char,std::char_traits<char>>);
    }
  }
  local_f8 = 0.0;
  while( true ) {
    bVar2 = std::vector<double,_std::allocator<double>_>::empty
                      ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe70);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    pvVar8 = std::vector<double,_std::allocator<double>_>::back
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe60);
    local_f8 = *pvVar8 + local_f8;
    std::vector<double,_std::allocator<double>_>::pop_back
              ((vector<double,_std::allocator<double>_> *)0x105c3d);
  }
  poVar7 = std::operator<<((ostream *)&std::cout,",");
  auVar11._8_4_ = (int)((ulong)local_18 >> 0x20);
  auVar11._0_8_ = local_18;
  auVar11._12_4_ = 0x45300000;
  std::ostream::operator<<
            (poVar7,local_f8 /
                    ((auVar11._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)local_18) - 4503599627370496.0)));
  (**(code **)(*local_8 + 0x18))();
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe70);
  return;
}

Assistant:

void test_insertion(MemoryContainer<Iterator> &c,
                    std::vector<MemoryMapping> &values,
                    std::size_t numRepeat) {
  ptime tini, tend;
  std::vector<double> times;
  // Insert
  {
    for( std::size_t repeat = 0, repeat_max = numRepeat
           ; repeat != repeat_max
           ; ++repeat){
      c.clear();
      tini = microsec_clock::universal_time();
      for( std::size_t i = 0, max = values.size()
             ; i != max
             ; ++i){
        c.insert(values[i]);
      }
      tend = microsec_clock::universal_time();
      times.push_back(double((tend-tini).total_nanoseconds())
                      /double(values.size()));
      //std::cout << "," << times.back();
      if(c.size() != values.size()){
        std::cerr << "    ERROR: size not consistent" << std::endl;
      }
    }
    double total = 0.0;
    while(!times.empty()) {
      total += times.back();
      times.pop_back();
    }
    std::cout << "," << total/numRepeat;
  }
  // Search
  {
    for( std::size_t repeat = 0, repeat_max = numRepeat
           ; repeat != repeat_max
           ; ++repeat){
      std::size_t found = 0;
      tini = microsec_clock::universal_time();
      for( std::size_t i = 0, max = values.size()
             ; i != max
             ; ++i){
        found += static_cast<std::size_t>(c.end() != c.find(values[i]));
      }
      tend = microsec_clock::universal_time();
      times.push_back(double((tend-tini).total_nanoseconds())/
                      double(values.size()));
      //std::cout << "," << times.back();
      if(found != values.size()){
        std::cerr << "    ERROR: not all found, "
                  << found << " found out of " << values.size()
                  << std::endl;
      }
    }
    double total = 0.0;
    while(!times.empty()) {
      total += times.back();
      times.pop_back();
    }
    std::cout << "," << total/numRepeat;
  }
  c.clear();
}